

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *input)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_RSI;
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  string *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  undefined5 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcd;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  undefined4 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdec;
  byte in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  byte in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  undefined8 local_68;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b25b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b25be);
  ::std::__cxx11::string::string(in_stack_fffffffffffffdc0);
  local_68 = local_10;
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffda8);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffda8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffda8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ::std::
      make_tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffdb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdc0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdc0);
      return in_RDI;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_70);
    ::std::__cxx11::string::string
              (in_stack_fffffffffffffdf0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdef,
                        CONCAT16(in_stack_fffffffffffffdee,
                                 CONCAT15(in_stack_fffffffffffffded,
                                          CONCAT14(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8)))));
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (&local_98);
    if (sVar2 != 0) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(&local_98);
      if (((sVar2 < 2) ||
          (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                                 (size_type)in_stack_fffffffffffffda8), *pvVar3 != '-')) ||
         (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                              (size_type)in_stack_fffffffffffffda8), *pvVar3 == '-')) {
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(&local_98);
        in_stack_fffffffffffffded = 0;
        in_stack_fffffffffffffdef = in_stack_fffffffffffffded;
        if (2 < sVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdcf,
                              CONCAT16(in_stack_fffffffffffffdce,
                                       CONCAT15(in_stack_fffffffffffffdcd,in_stack_fffffffffffffdc8)
                                      )),(size_type)in_stack_fffffffffffffdc0,
                     (size_type)in_stack_fffffffffffffdb8);
          in_stack_fffffffffffffded =
               ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                                 (char *)in_stack_fffffffffffffda8);
          in_stack_fffffffffffffdee = in_stack_fffffffffffffded;
          in_stack_fffffffffffffdef = in_stack_fffffffffffffded;
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
        }
        if ((in_stack_fffffffffffffded & 1) == 0) {
          in_stack_fffffffffffffdcf =
               ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                                 (char *)in_stack_fffffffffffffda8);
          if ((((bool)in_stack_fffffffffffffdcf) ||
              (in_stack_fffffffffffffdce =
                    ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffdb7,
                                                  in_stack_fffffffffffffdb0),
                                      (char *)in_stack_fffffffffffffda8),
              (bool)in_stack_fffffffffffffdce)) ||
             (in_stack_fffffffffffffdcd =
                   ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0
                                                ),(char *)in_stack_fffffffffffffda8),
             (bool)in_stack_fffffffffffffdcd)) {
            uVar4 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string
                      (in_stack_fffffffffffffdf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            BadNameString::ReservedName
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            __cxa_throw(uVar4,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1b2c37);
          if (!bVar1) {
            uVar4 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string
                      (in_stack_fffffffffffffdf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            BadNameString::MultiPositionalNames
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            __cxa_throw(uVar4,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          in_stack_fffffffffffffdb7 = valid_name_string(in_stack_fffffffffffffdb8);
          if (!(bool)in_stack_fffffffffffffdb7) {
            uVar4 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string
                      (in_stack_fffffffffffffdf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            BadNameString::BadPositionalName
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            __cxa_throw(uVar4,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                     in_stack_fffffffffffffda8);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdcf,
                              CONCAT16(in_stack_fffffffffffffdce,
                                       CONCAT15(in_stack_fffffffffffffdcd,in_stack_fffffffffffffdc8)
                                      )),(size_type)in_stack_fffffffffffffdc0,
                     (size_type)in_stack_fffffffffffffdb8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdf8);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
          in_stack_fffffffffffffdec = valid_name_string(in_stack_fffffffffffffdb8);
          if (!(bool)in_stack_fffffffffffffdec) {
            uVar4 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string
                      (in_stack_fffffffffffffdf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            BadNameString::BadLongName
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            __cxa_throw(uVar4,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        }
      }
      else {
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(&local_98);
        if (sVar2 != 2) {
LAB_001b2764:
          sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  length(&local_98);
          if (2 < sVar2) {
            uVar4 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string
                      (in_stack_fffffffffffffdf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            BadNameString::MissingDash
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           in_stack_fffffffffffffde8)))));
            __cxa_throw(uVar4,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffdef,
                                   CONCAT16(in_stack_fffffffffffffdee,
                                            CONCAT15(in_stack_fffffffffffffded,
                                                     CONCAT14(in_stack_fffffffffffffdec,
                                                              in_stack_fffffffffffffde8)))));
          BadNameString::OneCharName
                    ((string *)
                     CONCAT17(in_stack_fffffffffffffdef,
                              CONCAT16(in_stack_fffffffffffffdee,
                                       CONCAT15(in_stack_fffffffffffffded,
                                                CONCAT14(in_stack_fffffffffffffdec,
                                                         in_stack_fffffffffffffde8)))));
          __cxa_throw(this,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                            (size_type)in_stack_fffffffffffffda8);
        in_stack_fffffffffffffe07 = valid_first_char<char>(*pvVar3);
        if (!(bool)in_stack_fffffffffffffe07) goto LAB_001b2764;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                   (size_type)in_stack_fffffffffffffda8);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<int,char&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
                   (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      }
    }
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_70);
  } while( true );
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else if(name.length() > 2)
                throw BadNameString::MissingDash(name);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty())
                throw BadNameString::MultiPositionalNames(name);
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}